

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeIteratorImpl.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DOMNodeIteratorImpl::DOMNodeIteratorImpl
          (DOMNodeIteratorImpl *this,DOMNodeIteratorImpl *toCopy)

{
  (this->super_DOMNodeIterator)._vptr_DOMNodeIterator =
       (_func_int **)&PTR__DOMNodeIteratorImpl_00411720;
  this->fRoot = toCopy->fRoot;
  this->fDocument = toCopy->fDocument;
  this->fWhatToShow = toCopy->fWhatToShow;
  this->fNodeFilter = toCopy->fNodeFilter;
  this->fExpandEntityReferences = toCopy->fExpandEntityReferences;
  this->fDetached = toCopy->fDetached;
  this->fCurrentNode = toCopy->fCurrentNode;
  this->fForward = toCopy->fForward;
  return;
}

Assistant:

DOMNodeIteratorImpl::DOMNodeIteratorImpl ( const DOMNodeIteratorImpl& toCopy)
    : DOMNodeIterator(toCopy),
    fRoot(toCopy.fRoot),
    fDocument(toCopy.fDocument),
    fWhatToShow(toCopy.fWhatToShow),
    fNodeFilter(toCopy.fNodeFilter),
    fExpandEntityReferences(toCopy.fExpandEntityReferences),
    fDetached(toCopy.fDetached),
    fCurrentNode(toCopy.fCurrentNode),
    fForward(toCopy.fForward)
{
}